

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

SubroutineSymbol * __thiscall slang::ast::ClassType::getConstructor(ClassType *this)

{
  Scope *this_00;
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  long lVar3;
  Compilation *compilation;
  SubroutineSymbol *pSVar4;
  Type *returnType;
  SubroutineSymbol *sub;
  string_view name;
  string_view name_00;
  MethodBuilder builder;
  
  this_00 = &this->super_Scope;
  name._M_str = "new";
  name._M_len = 3;
  pSVar4 = (SubroutineSymbol *)Scope::find(this_00,name);
  if (((pSVar4 == (SubroutineSymbol *)0x0) || ((pSVar4->super_Symbol).kind != Subroutine)) ||
     (((pSVar4->flags).m_bits & 8) == 0)) {
    pSVar1 = (this->super_Type).super_Symbol.parentScope;
    pSVar2 = (this->super_Type).super_Symbol.originatingSyntax;
    if (((pSVar1 == (Scope *)0x0 || pSVar2 == (SyntaxNode *)0x0) ||
        (lVar3 = *(long *)(pSVar2 + 6), lVar3 == 0)) || (*(long *)(lVar3 + 0x38) == 0)) {
      pSVar4 = (SubroutineSymbol *)0x0;
    }
    else {
      compilation = pSVar1->compilation;
      returnType = compilation->voidType;
      name_00._M_str = "new";
      name_00._M_len = 3;
      MethodBuilder::MethodBuilder(&builder,compilation,name_00,returnType,Function);
      MethodBuilder::addFlags(&builder,(bitmask<slang::ast::MethodFlags>)0x1008);
      SubroutineSymbol::inheritDefaultedArgList
                ((SubroutineSymbol *)&(builder.symbol)->super_Scope,this_00,
                 *(Scope **)(lVar3 + 0x38),(SyntaxNode *)&builder.args,
                 (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)returnType);
      Scope::insertMember(this_00,&(builder.symbol)->super_Symbol,(this->super_Scope).lastMember,
                          true,true);
      MethodBuilder::~MethodBuilder(&builder);
      pSVar4 = builder.symbol;
    }
  }
  return pSVar4;
}

Assistant:

const SubroutineSymbol* ClassType::getConstructor() const {
    if (auto constructor = find("new");
        constructor && constructor->kind == SymbolKind::Subroutine) {
        auto& sub = constructor->as<SubroutineSymbol>();
        if (sub.flags.has(MethodFlags::Constructor))
            return &sub;
    }

    // If our extends clause specifies 'default' for the argument list
    // we will auto-generate an appropriate constructor if the user
    // has not provided one.
    auto syntax = getSyntax();
    auto scope = getParentScope();
    if (syntax && scope) {
        auto extendsClause = syntax->as<ClassDeclarationSyntax>().extendsClause;
        if (extendsClause && extendsClause->defaultedArg) {
            auto& comp = scope->getCompilation();
            MethodBuilder builder(comp, "new", comp.getVoidType(), SubroutineKind::Function);
            builder.addFlags(MethodFlags::Constructor | MethodFlags::DefaultedSuperArg);

            SubroutineSymbol::inheritDefaultedArgList(builder.symbol, *this,
                                                      *extendsClause->defaultedArg, builder.args);

            insertMember(&builder.symbol, getLastMember(), true, true);
            return &builder.symbol;
        }
    }

    return nullptr;
}